

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall
GlobOpt::TryOptConstFoldBrUnsignedLessThan
          (GlobOpt *this,Instr *instr,bool branchOnLessThan,Value *src1Value,int32 min1,int32 max1,
          Value *src2Value,int32 min2,int32 max2)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ValueInfo *pVVar4;
  uint *puVar5;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint uMax2;
  uint local_54;
  uint local_50;
  uint uMin2;
  uint local_48;
  uint local_44;
  uint uMax1;
  uint local_3c;
  uint local_38;
  uint uMin1;
  int32 max1_local;
  int32 min1_local;
  Value *src1Value_local;
  Instr *pIStack_20;
  bool branchOnLessThan_local;
  Instr *instr_local;
  GlobOpt *this_local;
  
  local_38 = max1;
  uMin1 = min1;
  _max1_local = src1Value;
  src1Value_local._7_1_ = branchOnLessThan;
  pIStack_20 = instr;
  instr_local = (Instr *)this;
  bVar2 = DoConstFold(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2854,"(DoConstFold())","DoConstFold()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = IsLoopPrePass(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2855,"(!IsLoopPrePass())","!IsLoopPrePass()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((_max1_local != (Value *)0x0) && (src2Value != (Value *)0x0)) {
    bVar2 = DoAggressiveIntTypeSpec(this);
    if (bVar2) {
      pVVar4 = ::Value::GetValueInfo(_max1_local);
      bVar2 = ValueType::IsLikelyInt(&pVVar4->super_ValueType);
      if (bVar2) {
        pVVar4 = ::Value::GetValueInfo(src2Value);
        bVar2 = ValueType::IsLikelyInt(&pVVar4->super_ValueType);
        if (bVar2) goto LAB_005a6a84;
      }
    }
    else {
      pVVar4 = ::Value::GetValueInfo(_max1_local);
      bVar2 = ValueType::IsInt(&pVVar4->super_ValueType);
      if (bVar2) {
        pVVar4 = ::Value::GetValueInfo(src2Value);
        bVar2 = ValueType::IsInt(&pVVar4->super_ValueType);
        if (bVar2) {
LAB_005a6a84:
          if ((int)uMin1 < 0) {
            if ((int)local_38 < 0) {
              uMax1 = uMin1;
              local_44 = local_38;
              puVar5 = min<unsigned_int>(&uMax1,&local_44);
              local_74 = *puVar5;
            }
            else {
              local_74 = 0;
            }
            local_78 = local_74;
          }
          else {
            local_78 = uMin1;
          }
          local_3c = local_78;
          uMin2 = uMin1;
          local_50 = local_38;
          puVar5 = max<unsigned_int>(&uMin2,&local_50);
          local_48 = *puVar5;
          if (min2 < 0) {
            if (max2 < 0) {
              uMax2 = min2;
              local_5c = max2;
              puVar5 = min<unsigned_int>(&uMax2,&local_5c);
              local_7c = *puVar5;
            }
            else {
              local_7c = 0;
            }
            local_80 = local_7c;
          }
          else {
            local_80 = min2;
          }
          local_54 = local_80;
          local_64 = min2;
          local_68 = max2;
          puVar5 = max<unsigned_int>(&local_64,&local_68);
          local_60 = *puVar5;
          if (local_48 < local_54) {
            OptConstFoldBr(this,(bool)(src1Value_local._7_1_ & 1),pIStack_20,_max1_local,src2Value);
            return true;
          }
          if (local_60 <= local_3c) {
            OptConstFoldBr(this,(bool)((src1Value_local._7_1_ ^ 0xff) & 1),pIStack_20,_max1_local,
                           src2Value);
            return true;
          }
          return false;
        }
      }
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::TryOptConstFoldBrUnsignedLessThan(
    IR::Instr *const instr,
    const bool branchOnLessThan,
    Value *const src1Value,
    const int32 min1,
    const int32 max1,
    Value *const src2Value,
    const int32 min2,
    const int32 max2)
{
    Assert(DoConstFold());
    Assert(!IsLoopPrePass());

    if(!src1Value ||
        !src2Value ||
        !(
            DoAggressiveIntTypeSpec()
                ? src1Value->GetValueInfo()->IsLikelyInt() && src2Value->GetValueInfo()->IsLikelyInt()
                : src1Value->GetValueInfo()->IsInt() && src2Value->GetValueInfo()->IsInt()
        ))
    {
        return false;
    }

    uint uMin1 = (min1 < 0 ? (max1 < 0 ? min((uint)min1, (uint)max1) : 0) : min1);
    uint uMax1 = max((uint)min1, (uint)max1);
    uint uMin2 = (min2 < 0 ? (max2 < 0 ? min((uint)min2, (uint)max2) : 0) : min2);
    uint uMax2 = max((uint)min2, (uint)max2);

    if (uMax1 < uMin2)
    {
        // Range 1 is always lesser than Range 2
        OptConstFoldBr(branchOnLessThan, instr, src1Value, src2Value);
        return true;
    }
    if (uMin1 >= uMax2)
    {
        // Range 2 is always lesser than Range 1
        OptConstFoldBr(!branchOnLessThan, instr, src1Value, src2Value);
        return true;
    }
    return false;
}